

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcdata_op.cc
# Opt level: O1

void __thiscall Funcdata::truncatedFlow(Funcdata *this,Funcdata *fd,FlowInfo *flow)

{
  PcodeOpBank *this_00;
  pointer *pppFVar1;
  pointer *pppJVar2;
  FuncCallSpecs *this_01;
  Varnode *vn;
  iterator __position;
  iterator __position_00;
  int iVar3;
  pointer ppFVar4;
  PcodeOp *pPVar5;
  undefined4 extraout_var;
  Varnode *vn_00;
  Architecture *this_02;
  LowlevelError *pLVar6;
  vector<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_> *pvVar7;
  void *__child_stack;
  void *in_R8;
  _List_node_base *p_Var8;
  undefined1 *puVar9;
  pointer ppJVar10;
  FlowInfo partialflow;
  undefined1 local_1b8 [128];
  pointer local_138;
  pointer local_130;
  uint local_74;
  
  if ((this->obank).optree._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    pLVar6 = (LowlevelError *)__cxa_allocate_exception(0x20);
    local_1b8._0_8_ = local_1b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,"Trying to do truncated flow on pre-existing pcode","");
    LowlevelError::LowlevelError(pLVar6,(string *)local_1b8);
    __cxa_throw(pLVar6,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
  }
  for (p_Var8 = (fd->obank).deadlist.super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl
                ._M_node.super__List_node_base._M_next;
      p_Var8 != (_List_node_base *)&(fd->obank).deadlist; p_Var8 = p_Var8->_M_next) {
    cloneOp(this,(PcodeOp *)p_Var8[1]._M_next,&((PcodeOp *)p_Var8[1]._M_next)->start);
  }
  this_00 = &this->obank;
  (this->obank).uniqid = (fd->obank).uniqid;
  ppFVar4 = (fd->qlst).super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  if ((fd->qlst).super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppFVar4) {
    puVar9 = (undefined1 *)0x0;
    pvVar7 = &this->qlst;
    do {
      iVar3 = (int)pvVar7;
      this_01 = ppFVar4[(long)puVar9];
      pPVar5 = PcodeOpBank::findOp(this_00,&this_01->op->start);
      iVar3 = FuncCallSpecs::clone(this_01,(__fn *)pPVar5,__child_stack,iVar3,in_R8);
      local_1b8._0_8_ = CONCAT44(extraout_var,iVar3);
      vn = *(pPVar5->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
      if (((vn->loc).base)->type == IPTR_FSPEC) {
        vn_00 = newVarnodeCallSpecs(this,(FuncCallSpecs *)local_1b8._0_8_);
        opSetInput(this,pPVar5,vn_00,0);
        VarnodeBank::destroy(&this->vbank,vn);
      }
      __position._M_current =
           (this->qlst).super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->qlst).super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<FuncCallSpecs*,std::allocator<FuncCallSpecs*>>::
        _M_realloc_insert<FuncCallSpecs*const&>
                  ((vector<FuncCallSpecs*,std::allocator<FuncCallSpecs*>> *)&this->qlst,__position,
                   (FuncCallSpecs **)local_1b8);
      }
      else {
        *__position._M_current = (FuncCallSpecs *)local_1b8._0_8_;
        pppFVar1 = &(this->qlst).
                    super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppFVar1 = *pppFVar1 + 1;
      }
      puVar9 = puVar9 + 1;
      ppFVar4 = (fd->qlst).super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pvVar7 = (vector<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_> *)
               ((long)(fd->qlst).
                      super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppFVar4 >> 3);
    } while (puVar9 < pvVar7);
  }
  ppJVar10 = (fd->jumpvec).super__Vector_base<JumpTable_*,_std::allocator<JumpTable_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppJVar10 !=
      (fd->jumpvec).super__Vector_base<JumpTable_*,_std::allocator<JumpTable_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      if ((*ppJVar10)->indirect != (PcodeOp *)0x0) {
        pPVar5 = PcodeOpBank::findOp(this_00,&(*ppJVar10)->indirect->start);
        if (pPVar5 == (PcodeOp *)0x0) {
          pLVar6 = (LowlevelError *)__cxa_allocate_exception(0x20);
          local_1b8._0_8_ = local_1b8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1b8,"Could not trace jumptable across partial clone","");
          LowlevelError::LowlevelError(pLVar6,(string *)local_1b8);
          __cxa_throw(pLVar6,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
        }
        this_02 = (Architecture *)operator_new(0xb0);
        JumpTable::JumpTable((JumpTable *)this_02,*ppJVar10);
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&(this_02->super_AddrSpaceManager).shortcut2Space)[1]._M_allocated_capacity =
             (size_type)(pPVar5->start).pc.base;
        *(uintb *)((long)&(this_02->super_AddrSpaceManager).shortcut2Space + 0x18) =
             (pPVar5->start).pc.offset;
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&(this_02->super_AddrSpaceManager).shortcut2Space)[2]._M_allocated_capacity =
             (size_type)pPVar5;
        __position_00._M_current =
             (this->jumpvec).super__Vector_base<JumpTable_*,_std::allocator<JumpTable_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1b8._0_8_ = this_02;
        if (__position_00._M_current ==
            (this->jumpvec).super__Vector_base<JumpTable_*,_std::allocator<JumpTable_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<JumpTable*,std::allocator<JumpTable*>>::_M_realloc_insert<JumpTable*const&>
                    ((vector<JumpTable*,std::allocator<JumpTable*>> *)&this->jumpvec,__position_00,
                     (JumpTable **)local_1b8);
        }
        else {
          *__position_00._M_current = (JumpTable *)this_02;
          pppJVar2 = &(this->jumpvec).super__Vector_base<JumpTable_*,_std::allocator<JumpTable_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppJVar2 = *pppJVar2 + 1;
        }
      }
      ppJVar10 = ppJVar10 + 1;
    } while (ppJVar10 !=
             (fd->jumpvec).super__Vector_base<JumpTable_*,_std::allocator<JumpTable_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  FlowInfo::FlowInfo((FlowInfo *)local_1b8,this,this_00,&this->bblocks,&this->qlst,flow);
  if (local_138 != local_130) {
    FlowInfo::injectPcode((FlowInfo *)local_1b8);
  }
  local_74 = local_74 & 0x1000;
  FlowInfo::generateBlocks((FlowInfo *)local_1b8);
  *(byte *)&this->flags = (byte)this->flags | 2;
  FlowInfo::~FlowInfo((FlowInfo *)local_1b8);
  return;
}

Assistant:

void Funcdata::truncatedFlow(const Funcdata *fd,const FlowInfo *flow)

{
  if (!obank.empty())
    throw LowlevelError("Trying to do truncated flow on pre-existing pcode");

  list<PcodeOp *>::const_iterator oiter; // Clone the raw pcode
  for(oiter=fd->obank.beginDead();oiter!=fd->obank.endDead();++oiter)
    cloneOp(*oiter,(*oiter)->getSeqNum());
  obank.setUniqId(fd->obank.getUniqId());

  // Clone callspecs
  for(int4 i=0;i<fd->qlst.size();++i) {
    FuncCallSpecs *oldspec = fd->qlst[i];
    PcodeOp *newop = findOp(oldspec->getOp()->getSeqNum());
    FuncCallSpecs *newspec = oldspec->clone(newop);
    Varnode *invn0 = newop->getIn(0);
    if (invn0->getSpace()->getType() == IPTR_FSPEC) { // Replace embedded pointer to callspec
      Varnode *newvn0 = newVarnodeCallSpecs(newspec);
      opSetInput(newop,newvn0,0);
      deleteVarnode(invn0);
    }
    qlst.push_back(newspec);
  }

  vector<JumpTable *>::const_iterator jiter; // Clone the jumptables
  for(jiter=fd->jumpvec.begin();jiter!=fd->jumpvec.end();++jiter) {
    PcodeOp *indop = (*jiter)->getIndirectOp();
    if (indop == (PcodeOp *)0)	// If indirect op has not been linked, this is probably a jumptable override
      continue;			// that has not been reached by the flow yet, so we ignore/truncate it
    PcodeOp *newop = findOp(indop->getSeqNum());
    if (newop == (PcodeOp *)0)
      throw LowlevelError("Could not trace jumptable across partial clone");
    JumpTable *jtclone = new JumpTable(*jiter);
    jtclone->setIndirectOp(newop);
    jumpvec.push_back(jtclone);
  }

  FlowInfo partialflow(*this,obank,bblocks,qlst,flow); // Clone the flow
  if (partialflow.hasInject())
    partialflow.injectPcode();
  // Clear error reporting flags
  // Keep possible unreachable flag
  partialflow.clearFlags(~((uint4)FlowInfo::possible_unreachable));

  partialflow.generateBlocks(); // Generate basic blocks for partial flow
  flags |= blocks_generated;
}